

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineTemplate.h
# Opt level: O0

void __thiscall
kiste::LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::call
          (LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,
          string *expression)

{
  string *expression_local;
  LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this_local;
  
  open_exception_handling(this);
  cpp::text(this->_serialize,"static_assert(std::is_same<decltype(");
  cpp::raw<std::__cxx11::string_const&>(this->_serialize,expression);
  cpp::text(this->_serialize,"), void>::value, \"$call{} requires void expression\"); (");
  cpp::raw<std::__cxx11::string_const&>(this->_serialize,expression);
  cpp::text(this->_serialize,");");
  close_exception_handling(this,expression);
  return;
}

Assistant:

void call(const std::string& expression)
    {
      static_assert(std::is_same<decltype(open_exception_handling()), void>::value,
                    "$call{} requires void expression");
      (open_exception_handling());
      _serialize.text("static_assert(std::is_same<decltype(");
      _serialize.raw(expression);
      _serialize.text("), void>::value, \"$call{} requires void expression\"); (");
      _serialize.raw(expression);
      _serialize.text(");");
      static_assert(std::is_same<decltype(close_exception_handling(expression)), void>::value,
                    "$call{} requires void expression");
      (close_exception_handling(expression));
    }